

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

Orientations __thiscall
QGridLayoutPrivate::expandingDirections(QGridLayoutPrivate *this,int hSpacing,int vSpacing)

{
  const_reference pQVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int c;
  int r;
  QGridLayoutPrivate *that;
  Orientations ret;
  int in_stack_000000d8;
  int in_stack_000000dc;
  QGridLayoutPrivate *in_stack_000000e0;
  qsizetype in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  int local_2c;
  QFlagsStorage<Qt::Orientation> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  setupLayoutData(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8);
  local_c.i = 0xaaaaaaaa;
  QFlags<Qt::Orientation>::QFlags((QFlags<Qt::Orientation> *)0x3328d8);
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0xb0); local_2c = local_2c + 1) {
    pQVar1 = QList<QLayoutStruct>::at
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if ((pQVar1->expansive & 1U) != 0) {
      QFlags<Qt::Orientation>::operator|=((QFlags<Qt::Orientation> *)&local_c,Vertical);
      break;
    }
  }
  local_30 = 0;
  do {
    if (*(int *)(in_RDI + 0xb4) <= local_30) {
LAB_00332982:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (QFlagsStorageHelper<Qt::Orientation,_4>)
               (QFlagsStorageHelper<Qt::Orientation,_4>)local_c.i;
      }
      __stack_chk_fail();
    }
    pQVar1 = QList<QLayoutStruct>::at
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if ((pQVar1->expansive & 1U) != 0) {
      QFlags<Qt::Orientation>::operator|=((QFlags<Qt::Orientation> *)&local_c,Horizontal);
      goto LAB_00332982;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

Qt::Orientations QGridLayoutPrivate::expandingDirections(int hSpacing, int vSpacing) const
{
    QGridLayoutPrivate *that = const_cast<QGridLayoutPrivate*>(this);
    that->setupLayoutData(hSpacing, vSpacing);
    Qt::Orientations ret;

    for (int r = 0; r < rr; r++) {
        if (rowData.at(r).expansive) {
            ret |= Qt::Vertical;
            break;
        }
    }
    for (int c = 0; c < cc; c++) {
        if (colData.at(c).expansive) {
            ret |= Qt::Horizontal;
            break;
        }
    }
    return ret;
}